

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O2

void duckdb::Node16::InsertChild(ART *art,Node *node,uint8_t byte,Node child)

{
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *n;
  Node node16;
  
  n = &Node::Ref<duckdb::Node16>(art,(Node)(node->super_IndexPointer).data,NODE_16)->
       super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>;
  if (n->count == '\x10') {
    node16 = (Node)(node->super_IndexPointer).data;
    Node48::GrowNode16(art,node,&node16);
    Node48::InsertChild(art,node,byte,child);
    return;
  }
  BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::InsertChildInternal(n,byte,child);
  return;
}

Assistant:

void Node16::InsertChild(ART &art, Node &node, const uint8_t byte, const Node child) {
	// The node is full. Grow to Node48.
	auto &n16 = Node::Ref<Node16>(art, node, NODE_16);
	if (n16.count == CAPACITY) {
		auto node16 = node;
		Node48::GrowNode16(art, node, node16);
		Node48::InsertChild(art, node, byte, child);
		return;
	}

	InsertChildInternal(n16, byte, child);
}